

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool __thiscall CLI::App::check_name(App *this,string *name_to_check)

{
  pointer pcVar1;
  char *pcVar2;
  int iVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  pointer pbVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> les;
  string local_name;
  undefined1 local_161;
  string *local_160;
  char *local_158;
  size_t local_150;
  char local_148 [8];
  undefined8 uStack_140;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  long local_130;
  char local_128;
  undefined7 uStack_127;
  undefined8 uStack_120;
  char *local_118;
  long local_110;
  char local_108;
  undefined7 uStack_107;
  undefined8 uStack_100;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  long local_f0;
  char local_e8 [8];
  undefined8 uStack_e0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  long local_d0;
  char local_c8 [8];
  undefined8 uStack_c0;
  char *local_b8;
  long local_b0;
  char local_a8;
  undefined7 uStack_a7;
  undefined8 uStack_a0;
  char *local_98;
  size_t local_90;
  char local_88 [8];
  undefined8 uStack_80;
  char *local_78;
  long local_70;
  char local_68 [8];
  undefined8 uStack_60;
  undefined1 *local_58;
  size_t local_50;
  undefined1 local_48 [16];
  pointer local_38;
  
  local_58 = local_48;
  pcVar1 = (this->name_)._M_dataplus._M_p;
  local_160 = name_to_check;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (this->name_)._M_string_length);
  if (this->ignore_underscore_ == true) {
    pcVar1 = (this->name_)._M_dataplus._M_p;
    local_d8._M_current = local_c8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar1,pcVar1 + (this->name_)._M_string_length);
    local_118 = (char *)CONCAT71(local_118._1_7_,0x5f);
    _Var4 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_d8,local_d8._M_current + local_d0,
                       (_Iter_equals_val<const_char>)&local_118);
    local_150 = (long)_Var4._M_current - (long)local_d8._M_current;
    *_Var4._M_current = '\0';
    if (local_d8._M_current == local_c8) {
      uStack_140 = uStack_c0;
      local_158 = local_148;
    }
    else {
      local_158 = local_d8._M_current;
    }
    local_d0 = 0;
    local_c8[0] = '\0';
    local_d8._M_current = local_c8;
    ::std::__cxx11::string::operator=((string *)&local_58,(string *)&local_158);
    if (local_158 != local_148) {
      operator_delete(local_158);
    }
    if (local_d8._M_current != local_c8) {
      operator_delete(local_d8._M_current);
    }
    pcVar1 = (local_160->_M_dataplus)._M_p;
    local_f8._M_current = local_e8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar1,pcVar1 + local_160->_M_string_length);
    local_118 = (char *)CONCAT71(local_118._1_7_,0x5f);
    _Var4 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_f8,local_f8._M_current + local_f0,
                       (_Iter_equals_val<const_char>)&local_118);
    local_150 = (long)_Var4._M_current - (long)local_f8._M_current;
    *_Var4._M_current = '\0';
    if (local_f8._M_current == local_e8) {
      uStack_140 = uStack_e0;
      local_158 = local_148;
    }
    else {
      local_158 = local_f8._M_current;
    }
    local_f0 = 0;
    local_e8[0] = '\0';
    local_f8._M_current = local_e8;
    ::std::__cxx11::string::operator=((string *)local_160,(string *)&local_158);
    if (local_158 != local_148) {
      operator_delete(local_158);
    }
    if (local_f8._M_current != local_e8) {
      operator_delete(local_f8._M_current);
    }
  }
  if (this->ignore_case_ == true) {
    pcVar1 = (this->name_)._M_dataplus._M_p;
    local_78 = local_68;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar1,pcVar1 + (this->name_)._M_string_length);
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_78,local_78 + local_70,local_78);
    if (local_78 == local_68) {
      uStack_140 = uStack_60;
      local_158 = local_148;
    }
    else {
      local_158 = local_78;
    }
    local_150 = local_70;
    local_70 = 0;
    local_68[0] = '\0';
    local_78 = local_68;
    ::std::__cxx11::string::operator=((string *)&local_58,(string *)&local_158);
    if (local_158 != local_148) {
      operator_delete(local_158);
    }
    if (local_78 != local_68) {
      operator_delete(local_78);
    }
    pcVar1 = (local_160->_M_dataplus)._M_p;
    local_98 = local_88;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar1,pcVar1 + local_160->_M_string_length);
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_98,local_98 + local_90,local_98);
    if (local_98 == local_88) {
      uStack_140 = uStack_80;
      local_158 = local_148;
    }
    else {
      local_158 = local_98;
    }
    local_150 = local_90;
    local_90 = 0;
    local_88[0] = '\0';
    local_98 = local_88;
    ::std::__cxx11::string::operator=((string *)local_160,(string *)&local_158);
    if (local_158 != local_148) {
      operator_delete(local_158);
    }
    if (local_98 != local_88) {
      operator_delete(local_98);
    }
  }
  if (local_50 == local_160->_M_string_length) {
    bVar6 = true;
    if (local_50 == 0) goto LAB_001200e3;
    iVar3 = bcmp(local_58,(local_160->_M_dataplus)._M_p,local_50);
    bVar6 = true;
    if (iVar3 == 0) goto LAB_001200e3;
  }
  pbVar5 = (this->aliases_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->aliases_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 == local_38) {
    bVar6 = false;
  }
  else {
    do {
      local_158 = local_148;
      pcVar1 = (pbVar5->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,pcVar1,pcVar1 + pbVar5->_M_string_length);
      if (this->ignore_underscore_ == true) {
        local_138._M_current = &local_128;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,local_158,local_158 + local_150);
        local_161 = 0x5f;
        _Var4 = ::std::
                __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (local_138,local_138._M_current + local_130,
                           (_Iter_equals_val<const_char>)&local_161);
        local_110 = (long)_Var4._M_current - (long)local_138._M_current;
        *_Var4._M_current = '\0';
        if (local_138._M_current == &local_128) {
          uStack_100 = uStack_120;
          local_118 = &local_108;
        }
        else {
          local_118 = local_138._M_current;
        }
        _local_108 = CONCAT71(uStack_127,local_128);
        local_130 = 0;
        local_128 = '\0';
        local_138._M_current = &local_128;
        ::std::__cxx11::string::operator=((string *)&local_158,(string *)&local_118);
        if (local_118 != &local_108) {
          operator_delete(local_118);
        }
        if (local_138._M_current != &local_128) {
          operator_delete(local_138._M_current);
        }
      }
      if (this->ignore_case_ == true) {
        local_b8 = &local_a8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,local_158,local_158 + local_150);
        ::std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                  (local_b8,local_b8 + local_b0,local_b8);
        if (local_b8 == &local_a8) {
          uStack_100 = uStack_a0;
          local_118 = &local_108;
        }
        else {
          local_118 = local_b8;
        }
        _local_108 = CONCAT71(uStack_a7,local_a8);
        local_110 = local_b0;
        local_b0 = 0;
        local_a8 = '\0';
        local_b8 = &local_a8;
        ::std::__cxx11::string::operator=((string *)&local_158,(string *)&local_118);
        if (local_118 != &local_108) {
          operator_delete(local_118);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8);
        }
      }
      pcVar2 = local_158;
      if (local_150 == local_160->_M_string_length) {
        if (local_150 == 0) {
          bVar6 = true;
        }
        else {
          iVar3 = bcmp(local_158,(local_160->_M_dataplus)._M_p,local_150);
          bVar6 = iVar3 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (pcVar2 != local_148) {
        operator_delete(pcVar2);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != local_38 && bVar6 == false);
  }
LAB_001200e3:
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return bVar6;
}

Assistant:

bool check_name(std::string name_to_check) const {
        std::string local_name = name_;
        if(ignore_underscore_) {
            local_name = detail::remove_underscore(name_);
            name_to_check = detail::remove_underscore(name_to_check);
        }
        if(ignore_case_) {
            local_name = detail::to_lower(name_);
            name_to_check = detail::to_lower(name_to_check);
        }

        if(local_name == name_to_check) {
            return true;
        }
        for(auto les : aliases_) {
            if(ignore_underscore_) {
                les = detail::remove_underscore(les);
            }
            if(ignore_case_) {
                les = detail::to_lower(les);
            }
            if(les == name_to_check) {
                return true;
            }
        }
        return false;
    }